

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_decompress1X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  undefined1 *puVar1;
  char cVar2;
  size_t sVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  bool bVar13;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar3 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar3;
  }
  if (cSrcSize == 0) {
    return 0xffffffffffffffb8;
  }
  puVar1 = (undefined1 *)((long)dst + maxDstSize);
  cVar2 = (char)*(undefined2 *)((long)DTable + 2);
  if (cSrcSize < 8) {
    uVar10 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar10 = uVar10 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar10 = uVar10 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar10 = uVar10 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar10 = uVar10 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar10 = uVar10 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar10 = uVar10 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar4 == 0) {
      return 0xffffffffffffffec;
    }
    uVar6 = 0x1f;
    if (bVar4 != 0) {
      for (; bVar4 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = (uVar6 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    puVar12 = (ulong *)cSrc;
    if (3 < (long)maxDstSize) {
      uVar9 = 0;
      goto LAB_0021ac9a;
    }
  }
  else {
    bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar4 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    uVar9 = cSrcSize - 8;
    uVar10 = *(ulong *)((long)cSrc + (cSrcSize - 8));
    uVar6 = 0x1f;
    if (bVar4 != 0) {
      for (; bVar4 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = ~uVar6 + 9;
    puVar12 = (ulong *)((long)cSrc + uVar9);
    if (3 < (long)maxDstSize) {
LAB_0021ac9a:
      bVar4 = -cVar2 & 0x3f;
      do {
        if ((long)uVar9 < 8) {
          if (uVar9 == 0) goto LAB_0021adc5;
          uVar5 = uVar6 >> 3;
          bVar13 = cSrc <= (void *)((long)puVar12 - (ulong)uVar5);
          if (!bVar13) {
            uVar5 = (uint)uVar9;
          }
          uVar6 = uVar6 + uVar5 * -8;
        }
        else {
          uVar5 = uVar6 >> 3;
          uVar6 = uVar6 & 7;
          bVar13 = true;
        }
        uVar9 = uVar9 - uVar5;
        puVar12 = (ulong *)((long)cSrc + uVar9);
        uVar10 = *(ulong *)((long)cSrc + uVar9);
        if ((puVar1 + -3 <= dst) || (!bVar13)) goto LAB_0021adc5;
        if (cVar2 == '\0') goto LAB_0021ae25;
        uVar8 = (uVar10 << ((byte)uVar6 & 0x3f)) >> bVar4;
        iVar7 = *(byte *)((long)DTable + uVar8 * 2 + 4) + uVar6;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar8 * 2 + 5);
        uVar8 = (uVar10 << ((byte)iVar7 & 0x3f)) >> bVar4;
        iVar7 = (uint)*(byte *)((long)DTable + uVar8 * 2 + 4) + iVar7;
        uVar11 = (uVar10 << ((byte)iVar7 & 0x3f)) >> bVar4;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar8 * 2 + 5);
        iVar7 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar7;
        uVar8 = (uVar10 << ((byte)iVar7 & 0x3f)) >> bVar4;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
        uVar6 = (uint)*(byte *)((long)DTable + uVar8 * 2 + 4) + iVar7;
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar8 * 2 + 5);
        dst = (void *)((long)dst + 4);
        if (0x40 < uVar6) goto LAB_0021adc5;
      } while( true );
    }
    if ((long)cSrcSize < 0x10) {
      if (uVar9 == 0) goto LAB_0021adc5;
      uVar9 = uVar9 & 0xffffffff;
      if (cSrc <= (void *)((long)puVar12 - (ulong)(uVar6 >> 3))) {
        uVar9 = (ulong)(uVar6 >> 3);
      }
      uVar6 = uVar6 + (int)uVar9 * -8;
    }
    else {
      uVar9 = (ulong)(uVar6 >> 3);
      uVar6 = uVar6 & 7;
    }
    uVar10 = *(ulong *)((long)puVar12 - uVar9);
    puVar12 = (ulong *)((long)puVar12 - uVar9);
  }
LAB_0021adc5:
  if (dst < puVar1) {
    if (cVar2 == '\0') {
LAB_0021ae25:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                    ,0x15d,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    do {
      uVar9 = (uVar10 << ((byte)uVar6 & 0x3f)) >> (-cVar2 & 0x3fU);
      uVar6 = uVar6 + *(byte *)((long)DTable + uVar9 * 2 + 4);
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < puVar1);
  }
  if (uVar6 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puVar12 != (ulong *)cSrc) {
    maxDstSize = 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress1X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}